

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O0

int __thiscall
viennamath::rt_latex_function_symbol_processor<viennamath::rt_expression_interface<double>_>::clone
          (rt_latex_function_symbol_processor<viennamath::rt_expression_interface<double>_> *this,
          __fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  rt_latex_function_symbol_processor<viennamath::rt_expression_interface<double>_> *this_00;
  rt_latex_function_symbol_processor<viennamath::rt_expression_interface<double>_> *this_local;
  
  this_00 = (rt_latex_function_symbol_processor<viennamath::rt_expression_interface<double>_> *)
            operator_new(0x38);
  memset(this_00,0,0x38);
  rt_latex_function_symbol_processor(this_00);
  return (int)this_00;
}

Assistant:

rt_latex_processor_interface<InterfaceType> * clone() const { return new rt_latex_function_symbol_processor(); }